

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cc
# Opt level: O0

void __thiscall HighVariable::HighVariable(HighVariable *this,Varnode *vn)

{
  Varnode *local_18;
  Varnode *vn_local;
  HighVariable *this_local;
  
  local_18 = vn;
  vn_local = (Varnode *)this;
  std::vector<Varnode_*,_std::allocator<Varnode_*>_>::vector(&this->inst);
  Cover::Cover(&this->wholecover);
  this->numMergeClasses = 1;
  this->highflags = 7;
  this->flags = 0;
  this->type = (Datatype *)0x0;
  this->symbol = (Symbol *)0x0;
  this->symboloffset = -1;
  std::vector<Varnode_*,_std::allocator<Varnode_*>_>::push_back(&this->inst,&local_18);
  Varnode::setHigh(local_18,this,(short)this->numMergeClasses + -1);
  return;
}

Assistant:

HighVariable::HighVariable(Varnode *vn)

{
  numMergeClasses = 1;
  highflags = HighVariable::flagsdirty | HighVariable::typedirty | HighVariable::coverdirty;
  flags = 0;
  type = (Datatype *)0;
  symbol = (Symbol *)0;
  symboloffset = -1;
  inst.push_back(vn);
  vn->setHigh( this, numMergeClasses-1 );
}